

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O0

USTATUS __thiscall
FfsParser::parseBpdtRegion
          (FfsParser *this,UByteArray *region,UINT32 localOffset,UINT32 sbpdtOffsetFixup,
          UModelIndex *parent,UModelIndex *index)

{
  CBString *__return_storage_ptr__;
  ushort uVar1;
  UINT32 UVar2;
  TreeModel *pTVar3;
  ulong uVar4;
  UINT32 UVar5;
  UByteArray *pUVar6;
  bool bVar7;
  UINT8 UVar8;
  uint uVar9;
  uint uVar10;
  UINT32 UVar11;
  int32_t iVar12;
  uint uVar13;
  char *pcVar14;
  iterator __first;
  reference pvVar15;
  size_type sVar16;
  uchar *puVar17;
  uint *v;
  UModelIndex local_930;
  UByteArray local_918;
  UByteArray local_8f8;
  CBString local_8d8;
  CBString local_8c0;
  CBString local_8a8;
  undefined1 local_890 [8];
  UByteArray padding_3;
  UINT64 usedSize;
  UByteArray local_850;
  UByteArray local_830;
  CBString local_810;
  CBString local_7f8;
  CBString local_7e0;
  undefined1 local_7c8 [8];
  UByteArray padding_2;
  undefined1 local_790 [8];
  UModelIndex cpdIndex;
  UModelIndex sbpdtIndex;
  UByteArray local_740;
  undefined1 local_720 [8];
  UModelIndex partitionIndex;
  CBString text;
  CBString local_6d8;
  CBString local_6c0;
  CBString local_6a8;
  CBString local_690;
  CBString local_678;
  CBString local_660;
  CBString local_648;
  CBString local_630;
  CBString local_618;
  CBString local_600;
  CBString local_5e8;
  undefined1 local_5d0 [8];
  CBString info_1;
  UByteArray signature;
  UByteArray partition_1;
  CBString name_1;
  size_t i_2;
  const_iterator local_550;
  __normal_iterator<BPDT_PARTITION_INFO__*,_std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>_>
  local_548;
  iterator iter;
  __normal_iterator<BPDT_PARTITION_INFO__*,_std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>_>
  local_538;
  __normal_iterator<BPDT_PARTITION_INFO__*,_std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>_>
  local_530;
  const_iterator local_528;
  CBString local_520;
  BPDT_PARTITION_INFO_ *local_508;
  __normal_iterator<BPDT_PARTITION_INFO__*,_std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>_>
  local_500;
  __normal_iterator<BPDT_PARTITION_INFO__*,_std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>_>
  local_4f8;
  const_iterator local_4f0;
  CBString local_4e8;
  CBString local_4d0;
  BPDT_PARTITION_INFO_ *local_4b8;
  __normal_iterator<BPDT_PARTITION_INFO__*,_std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>_>
  local_4b0;
  __normal_iterator<BPDT_PARTITION_INFO__*,_std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>_>
  local_4a8;
  const_iterator local_4a0;
  CBString local_498;
  uint local_47c;
  ulong uStack_478;
  UINT32 previousPartitionEnd;
  size_t i_1;
  __normal_iterator<BPDT_PARTITION_INFO__*,_std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>_>
  local_468;
  const_iterator local_460;
  BPDT_PARTITION_INFO_ *local_458;
  __normal_iterator<BPDT_PARTITION_INFO__*,_std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>_>
  local_450;
  const_iterator local_448;
  CBString local_440;
  undefined1 auStack_428 [8];
  BPDT_PARTITION_INFO padding;
  undefined1 auStack_3e8 [8];
  BPDT_PARTITION_INFO padding_1;
  undefined1 auStack_3b8 [8];
  BPDT_PARTITION_INFO partition;
  UByteArray local_370;
  UByteArray local_350;
  CBString local_330;
  undefined1 auStack_318 [8];
  UModelIndex entryIndex;
  CBString local_2e8;
  CBString local_2d0;
  CBString local_2b8;
  CBString local_2a0;
  CBString local_288;
  CBString local_270;
  CBString local_258;
  CBString local_240;
  CBString local_228;
  CBString local_210;
  CBString local_1f8;
  CBString local_1e0;
  CBString local_1c8;
  uint *local_1b0;
  BPDT_ENTRY *ptEntry;
  UINT16 i;
  char *pcStack_1a0;
  UINT16 numEntries;
  BPDT_ENTRY *firstPtEntry;
  vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_> partitions;
  undefined1 local_178 [4];
  UINT32 offset;
  CBString local_158;
  UModelIndex local_140;
  undefined1 local_128 [8];
  CBString info;
  CBString name;
  UByteArray body;
  UByteArray header;
  UINT32 ptSize;
  UINT32 ptBodySize;
  BPDT_HEADER *ptHeader;
  CBString local_80;
  uint local_64;
  UModelIndex *pUStack_60;
  UINT32 regionSize;
  UModelIndex *index_local;
  UModelIndex *parent_local;
  UINT32 sbpdtOffsetFixup_local;
  UINT32 localOffset_local;
  UByteArray *region_local;
  FfsParser *this_local;
  
  pUStack_60 = index;
  index_local = parent;
  parent_local._0_4_ = sbpdtOffsetFixup;
  parent_local._4_4_ = localOffset;
  _sbpdtOffsetFixup_local = region;
  region_local = (UByteArray *)this;
  local_64 = UByteArray::size(region);
  if (local_64 < 0x18) {
    usprintf(&local_80,"%s: BPDT region too small to fit BPDT partition table header",
             "parseBpdtRegion");
    msg(this,&local_80,index_local);
    Bstrlib::CBString::~CBString(&local_80);
    this_local = (FfsParser *)0xfd;
  }
  else {
    pcVar14 = UByteArray::constData(_sbpdtOffsetFixup_local);
    uVar1 = *(ushort *)(pcVar14 + 4);
    uVar13 = (uint)uVar1 * 0xc + 0x18;
    if (local_64 < uVar13) {
      __return_storage_ptr__ = (CBString *)((long)&header.d.field_2 + 8);
      usprintf(__return_storage_ptr__,"%s: BPDT region too small to fit BPDT partition table",
               "parseBpdtRegion");
      msg(this,__return_storage_ptr__,index_local);
      Bstrlib::CBString::~CBString((CBString *)((long)&header.d.field_2 + 8));
      this_local = (FfsParser *)0xfd;
    }
    else {
      UByteArray::left((UByteArray *)((long)&body.d.field_2 + 8),_sbpdtOffsetFixup_local,0x18);
      UByteArray::mid((UByteArray *)&name.super_tagbstring.data,_sbpdtOffsetFixup_local,0x18,
                      (uint)uVar1 * 0xc);
      Bstrlib::CBString::CBString((CBString *)&info.super_tagbstring.data,"BPDT partition table");
      uVar9 = UByteArray::size((UByteArray *)((long)&body.d.field_2 + 8));
      uVar10 = UByteArray::size((UByteArray *)((long)&body.d.field_2 + 8));
      usprintf((CBString *)local_128,
               "Full size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nNumber of entries: %u\nVersion: %02Xh\nRedundancyFlag: %Xh\nIFWI version: %Xh\nFITC version: %u.%u.%u.%u"
               ,(ulong)uVar13,(ulong)uVar13,(ulong)uVar9,(ulong)uVar10);
      UVar11 = parent_local._4_4_;
      pTVar3 = this->model;
      Bstrlib::CBString::CBString(&local_158);
      UByteArray::UByteArray((UByteArray *)local_178);
      TreeModel::addItem(&local_140,pTVar3,UVar11,'\\','\0',(CBString *)&info.super_tagbstring.data,
                         &local_158,(CBString *)local_128,(UByteArray *)((long)&body.d.field_2 + 8),
                         (UByteArray *)&name.super_tagbstring.data,(UByteArray *)local_178,Fixed,
                         index_local,'\0');
      pUStack_60->r = local_140.r;
      pUStack_60->c = local_140.c;
      pUStack_60->i = local_140.i;
      pUStack_60->m = local_140.m;
      UByteArray::~UByteArray((UByteArray *)local_178);
      Bstrlib::CBString::~CBString(&local_158);
      partitions.super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x18;
      std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::vector
                ((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_> *)
                 &firstPtEntry);
      pcStack_1a0 = pcVar14 + 0x18;
      ptEntry._6_2_ = *(ushort *)(pcVar14 + 4);
      for (ptEntry._4_2_ = 0; ptEntry._4_2_ < ptEntry._6_2_; ptEntry._4_2_ = ptEntry._4_2_ + 1) {
        local_1b0 = (uint *)(pcStack_1a0 + (ulong)ptEntry._4_2_ * 0xc);
        bpdtEntryTypeToUString(&local_1c8,(UINT16)*local_1b0);
        Bstrlib::CBString::operator=((CBString *)&info.super_tagbstring.data,&local_1c8);
        Bstrlib::CBString::~CBString(&local_1c8);
        usprintf(&local_2a0,
                 "Full size: %Xh (%u)\nType: %Xh\nPartition offset: %Xh\nPartition length: %Xh",0xc,
                 0xc,(ulong)(ushort)*local_1b0,(ulong)local_1b0[1]);
        Bstrlib::CBString::CBString(&local_2b8,"\nSplit sub-partition first part: ");
        Bstrlib::CBString::operator+(&local_288,&local_2a0,&local_2b8);
        pcVar14 = "No";
        if ((*local_1b0 & 0x10000) != 0) {
          pcVar14 = "Yes";
        }
        Bstrlib::CBString::operator+(&local_270,&local_288,pcVar14);
        Bstrlib::CBString::CBString(&local_2d0,"\nSplit sub-partition second part: ");
        Bstrlib::CBString::operator+(&local_258,&local_270,&local_2d0);
        pcVar14 = "No";
        if ((*local_1b0 >> 0x11 & 1) != 0) {
          pcVar14 = "Yes";
        }
        Bstrlib::CBString::operator+(&local_240,&local_258,pcVar14);
        Bstrlib::CBString::CBString(&local_2e8,"\nCode sub-partition: ");
        Bstrlib::CBString::operator+(&local_228,&local_240,&local_2e8);
        pcVar14 = "No";
        if ((*local_1b0 >> 0x12 & 1) != 0) {
          pcVar14 = "Yes";
        }
        Bstrlib::CBString::operator+(&local_210,&local_228,pcVar14);
        Bstrlib::CBString::CBString((CBString *)&entryIndex.m,"\nUMA cacheable: ");
        Bstrlib::CBString::operator+(&local_1f8,&local_210,(CBString *)&entryIndex.m);
        pcVar14 = "No";
        if ((*local_1b0 >> 0x13 & 1) != 0) {
          pcVar14 = "Yes";
        }
        Bstrlib::CBString::operator+(&local_1e0,&local_1f8,pcVar14);
        Bstrlib::CBString::operator=((CBString *)local_128,&local_1e0);
        Bstrlib::CBString::~CBString(&local_1e0);
        Bstrlib::CBString::~CBString(&local_1f8);
        Bstrlib::CBString::~CBString((CBString *)&entryIndex.m);
        Bstrlib::CBString::~CBString(&local_210);
        Bstrlib::CBString::~CBString(&local_228);
        Bstrlib::CBString::~CBString(&local_2e8);
        Bstrlib::CBString::~CBString(&local_240);
        Bstrlib::CBString::~CBString(&local_258);
        Bstrlib::CBString::~CBString(&local_2d0);
        Bstrlib::CBString::~CBString(&local_270);
        Bstrlib::CBString::~CBString(&local_288);
        Bstrlib::CBString::~CBString(&local_2b8);
        Bstrlib::CBString::~CBString(&local_2a0);
        pTVar3 = this->model;
        UVar11 = parent_local._4_4_ +
                 partitions.
                 super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        Bstrlib::CBString::CBString(&local_330);
        UByteArray::UByteArray(&local_350);
        UByteArray::UByteArray(&local_370,(char *)local_1b0,0xc);
        UByteArray::UByteArray((UByteArray *)&partition.index.m);
        TreeModel::addItem((UModelIndex *)auStack_318,pTVar3,UVar11,']','\0',
                           (CBString *)&info.super_tagbstring.data,&local_330,(CBString *)local_128,
                           &local_350,&local_370,(UByteArray *)&partition.index.m,Fixed,pUStack_60,
                           '\0');
        UByteArray::~UByteArray((UByteArray *)&partition.index.m);
        UByteArray::~UByteArray(&local_370);
        UByteArray::~UByteArray(&local_350);
        Bstrlib::CBString::~CBString(&local_330);
        partitions.super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             partitions.
             super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage._4_4_ + 0xc;
        if (((local_1b0[1] != 0) && (local_1b0[1] != 0xffffffff)) && (local_1b0[2] != 0)) {
          partition.ptEntry.Size = 0;
          partition.type = '\0';
          partition._13_3_ = 0;
          partition.index.r = 0;
          partition.index.c = 0;
          auStack_3b8 = (undefined1  [8])0x0;
          partition.ptEntry._0_4_ = 0;
          partition.ptEntry.Offset = 0;
          partition.index.i = 0;
          BPDT_PARTITION_INFO_::BPDT_PARTITION_INFO_((BPDT_PARTITION_INFO_ *)auStack_3b8);
          partition.ptEntry._0_5_ = 0x5e00000000;
          partition.ptEntry._0_4_ = local_1b0[2];
          auStack_3b8._4_4_ = (undefined4)((ulong)*(undefined8 *)local_1b0 >> 0x20);
          auStack_3b8._0_4_ = (undefined4)*(undefined8 *)local_1b0;
          auStack_3b8._4_4_ = auStack_3b8._4_4_ - (UINT32)parent_local;
          partition.index.i = entryIndex.i;
          partition.ptEntry.Size = auStack_318._0_4_;
          partition.type = auStack_318[4];
          partition._13_3_ = auStack_318._5_3_;
          partition.index.r = entryIndex.r;
          partition.index.c = entryIndex.c;
          std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::push_back
                    ((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_> *)
                     &firstPtEntry,(value_type *)auStack_3b8);
        }
      }
      bVar7 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::empty
                        ((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_> *)
                         &firstPtEntry);
      if (bVar7) {
        padding_1.ptEntry.Size = 0;
        padding_1.type = '\0';
        padding_1._13_3_ = 0;
        padding_1.index.r = 0;
        padding_1.index.c = 0;
        auStack_3e8 = (undefined1  [8])0x0;
        padding_1.ptEntry._0_4_ = 0;
        padding_1.ptEntry.Offset = 0;
        padding_1.index.i = 0;
        BPDT_PARTITION_INFO_::BPDT_PARTITION_INFO_((BPDT_PARTITION_INFO_ *)auStack_3e8);
        auStack_3e8._4_4_ =
             partitions.
             super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage._4_4_;
        iVar12 = UByteArray::size(_sbpdtOffsetFixup_local);
        padding_1.ptEntry.Offset._0_1_ = 0x40;
        padding_1.ptEntry._0_4_ = iVar12 - auStack_3e8._4_4_;
        std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::push_back
                  ((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_> *)
                   &firstPtEntry,(value_type *)auStack_3e8);
      }
LAB_00126592:
      bVar7 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::empty
                        ((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_> *)
                         &firstPtEntry);
      if (!bVar7) {
        __first = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::begin
                            ((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_> *)
                             &firstPtEntry);
        padding.index.m =
             (TreeModel *)
             std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::end
                       ((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_> *)
                        &firstPtEntry);
        std::
        sort<__gnu_cxx::__normal_iterator<BPDT_PARTITION_INFO_*,std::vector<BPDT_PARTITION_INFO_,std::allocator<BPDT_PARTITION_INFO_>>>>
                  ((__normal_iterator<BPDT_PARTITION_INFO__*,_std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>_>
                    )__first._M_current,
                   (__normal_iterator<BPDT_PARTITION_INFO__*,_std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>_>
                    )padding.index.m);
        padding.ptEntry.Size = 0;
        padding.type = '\0';
        padding._13_3_ = 0;
        padding.index.r = 0;
        padding.index.c = 0;
        auStack_428 = (undefined1  [8])0x0;
        padding.ptEntry._0_4_ = 0;
        padding.ptEntry.Offset = 0;
        padding.index.i = 0;
        BPDT_PARTITION_INFO_::BPDT_PARTITION_INFO_((BPDT_PARTITION_INFO_ *)auStack_428);
        pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::front
                            ((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_> *)
                             &firstPtEntry);
        if ((pvVar15->ptEntry).Offset < uVar13) {
          usprintf(&local_440,
                   "%s: BPDT partition has intersection with BPDT partition table, skipped",
                   "parseBpdtRegion");
          pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::front
                              ((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                *)&firstPtEntry);
          msg(this,&local_440,&pvVar15->index);
          Bstrlib::CBString::~CBString(&local_440);
          local_450._M_current =
               (BPDT_PARTITION_INFO_ *)
               std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::begin
                         ((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_> *)
                          &firstPtEntry);
          __gnu_cxx::
          __normal_iterator<BPDT_PARTITION_INFO_const*,std::vector<BPDT_PARTITION_INFO_,std::allocator<BPDT_PARTITION_INFO_>>>
          ::__normal_iterator<BPDT_PARTITION_INFO_*>
                    ((__normal_iterator<BPDT_PARTITION_INFO_const*,std::vector<BPDT_PARTITION_INFO_,std::allocator<BPDT_PARTITION_INFO_>>>
                      *)&local_448,&local_450);
          local_458 = (BPDT_PARTITION_INFO_ *)
                      std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::
                      erase((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_> *)
                            &firstPtEntry,local_448);
        }
        else {
          pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::front
                              ((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                *)&firstPtEntry);
          if (uVar13 < (pvVar15->ptEntry).Offset) {
            auStack_428._4_4_ = uVar13;
            pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::
                      front((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_> *)
                            &firstPtEntry);
            padding.ptEntry.Offset._0_1_ = 0x40;
            padding.ptEntry._0_4_ = (pvVar15->ptEntry).Offset - auStack_428._4_4_;
            local_468._M_current =
                 (BPDT_PARTITION_INFO_ *)
                 std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::begin
                           ((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_> *)
                            &firstPtEntry);
            __gnu_cxx::
            __normal_iterator<BPDT_PARTITION_INFO_const*,std::vector<BPDT_PARTITION_INFO_,std::allocator<BPDT_PARTITION_INFO_>>>
            ::__normal_iterator<BPDT_PARTITION_INFO_*>
                      ((__normal_iterator<BPDT_PARTITION_INFO_const*,std::vector<BPDT_PARTITION_INFO_,std::allocator<BPDT_PARTITION_INFO_>>>
                        *)&local_460,&local_468);
            i_1 = (size_t)std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::
                          insert((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                  *)&firstPtEntry,local_460,(value_type *)auStack_428);
          }
          uStack_478 = 1;
LAB_001267c6:
          uVar4 = uStack_478;
          sVar16 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::size
                             ((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_> *
                              )&firstPtEntry);
          if (sVar16 <= uVar4) {
            for (name_1.super_tagbstring.data = (uchar *)0x0;
                puVar17 = (uchar *)std::
                                   vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                   ::size((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                           *)&firstPtEntry), name_1.super_tagbstring.data < puVar17;
                name_1.super_tagbstring.data = name_1.super_tagbstring.data + 1) {
              pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::
                        operator[]((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                    *)&firstPtEntry,(size_type)name_1.super_tagbstring.data);
              if (pvVar15->type == '^') {
                pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::
                          operator[]((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                      *)&firstPtEntry,(size_type)name_1.super_tagbstring.data);
                bpdtEntryTypeToUString
                          ((CBString *)((long)&partition_1.d.field_2 + 8),
                           *(UINT16 *)&pvVar15->ptEntry);
                pUVar6 = _sbpdtOffsetFixup_local;
                pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::
                          operator[]((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                      *)&firstPtEntry,(size_type)name_1.super_tagbstring.data);
                UVar11 = (pvVar15->ptEntry).Offset;
                pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::
                          operator[]((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                      *)&firstPtEntry,(size_type)name_1.super_tagbstring.data);
                UByteArray::mid((UByteArray *)((long)&signature.d.field_2 + 8),pUVar6,UVar11,
                                (pvVar15->ptEntry).Size);
                UByteArray::left((UByteArray *)&info_1.super_tagbstring.data,
                                 (UByteArray *)((long)&signature.d.field_2 + 8),4);
                uVar13 = UByteArray::size((UByteArray *)((long)&signature.d.field_2 + 8));
                uVar9 = UByteArray::size((UByteArray *)((long)&signature.d.field_2 + 8));
                std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::operator[]
                          ((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_> *)
                           &firstPtEntry,(size_type)name_1.super_tagbstring.data);
                usprintf(&local_690,"Full size: %Xh (%u)\nType: %Xh",(ulong)uVar13,(ulong)uVar9);
                Bstrlib::CBString::CBString(&local_6a8,"\nSplit sub-partition first part: ");
                Bstrlib::CBString::operator+(&local_678,&local_690,&local_6a8);
                pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::
                          operator[]((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                      *)&firstPtEntry,(size_type)name_1.super_tagbstring.data);
                pcVar14 = "No";
                if (((pvVar15->ptEntry).field_0x2 & 1) != 0) {
                  pcVar14 = "Yes";
                }
                Bstrlib::CBString::operator+(&local_660,&local_678,pcVar14);
                Bstrlib::CBString::CBString(&local_6c0,"\nSplit sub-partition second part: ");
                Bstrlib::CBString::operator+(&local_648,&local_660,&local_6c0);
                pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::
                          operator[]((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                      *)&firstPtEntry,(size_type)name_1.super_tagbstring.data);
                pcVar14 = "No";
                if ((*(uint *)&pvVar15->ptEntry >> 0x11 & 1) != 0) {
                  pcVar14 = "Yes";
                }
                Bstrlib::CBString::operator+(&local_630,&local_648,pcVar14);
                Bstrlib::CBString::CBString(&local_6d8,"\nCode sub-partition: ");
                Bstrlib::CBString::operator+(&local_618,&local_630,&local_6d8);
                pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::
                          operator[]((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                      *)&firstPtEntry,(size_type)name_1.super_tagbstring.data);
                pcVar14 = "No";
                if ((*(uint *)&pvVar15->ptEntry >> 0x12 & 1) != 0) {
                  pcVar14 = "Yes";
                }
                Bstrlib::CBString::operator+(&local_600,&local_618,pcVar14);
                Bstrlib::CBString::CBString
                          ((CBString *)&text.super_tagbstring.data,"\nUMA cacheable: ");
                Bstrlib::CBString::operator+
                          (&local_5e8,&local_600,(CBString *)&text.super_tagbstring.data);
                pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::
                          operator[]((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                      *)&firstPtEntry,(size_type)name_1.super_tagbstring.data);
                pcVar14 = "No";
                if ((*(uint *)&pvVar15->ptEntry >> 0x13 & 1) != 0) {
                  pcVar14 = "Yes";
                }
                Bstrlib::CBString::operator+((CBString *)local_5d0,&local_5e8,pcVar14);
                Bstrlib::CBString::~CBString(&local_5e8);
                Bstrlib::CBString::~CBString((CBString *)&text.super_tagbstring.data);
                Bstrlib::CBString::~CBString(&local_600);
                Bstrlib::CBString::~CBString(&local_618);
                Bstrlib::CBString::~CBString(&local_6d8);
                Bstrlib::CBString::~CBString(&local_630);
                Bstrlib::CBString::~CBString(&local_648);
                Bstrlib::CBString::~CBString(&local_6c0);
                Bstrlib::CBString::~CBString(&local_660);
                Bstrlib::CBString::~CBString(&local_678);
                Bstrlib::CBString::~CBString(&local_6a8);
                Bstrlib::CBString::~CBString(&local_690);
                pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::
                          operator[]((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                      *)&firstPtEntry,(size_type)name_1.super_tagbstring.data);
                bpdtEntryTypeToUString((CBString *)&partitionIndex.m,*(UINT16 *)&pvVar15->ptEntry);
                UVar2 = parent_local._4_4_;
                pTVar3 = this->model;
                pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::
                          operator[]((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                      *)&firstPtEntry,(size_type)name_1.super_tagbstring.data);
                UVar11 = (pvVar15->ptEntry).Offset;
                UByteArray::UByteArray(&local_740);
                UByteArray::UByteArray((UByteArray *)&sbpdtIndex.m);
                TreeModel::addItem((UModelIndex *)local_720,pTVar3,UVar2 + UVar11,'^','\0',
                                   (CBString *)((long)&partition_1.d.field_2 + 8),
                                   (CBString *)&partitionIndex.m,(CBString *)local_5d0,&local_740,
                                   (UByteArray *)((long)&signature.d.field_2 + 8),
                                   (UByteArray *)&sbpdtIndex.m,Fixed,index_local,'\0');
                UByteArray::~UByteArray((UByteArray *)&sbpdtIndex.m);
                UByteArray::~UByteArray(&local_740);
                pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::
                          operator[]((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                      *)&firstPtEntry,(size_type)name_1.super_tagbstring.data);
                if (((undefined1  [12])pvVar15->ptEntry & (undefined1  [12])0xffff) ==
                    (undefined1  [12])0x5) {
                  UModelIndex::UModelIndex((UModelIndex *)&cpdIndex.m);
                  pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                            ::operator[]((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                          *)&firstPtEntry,(size_type)name_1.super_tagbstring.data);
                  parseBpdtRegion(this,(UByteArray *)((long)&signature.d.field_2 + 8),0,
                                  (pvVar15->ptEntry).Offset,(UModelIndex *)local_720,
                                  (UModelIndex *)&cpdIndex.m);
                }
                v = (uint *)UByteArray::constData((UByteArray *)((long)&signature.d.field_2 + 8));
                uVar13 = readUnaligned<unsigned_int>(v);
                if (uVar13 == 0x44504324) {
                  UModelIndex::UModelIndex((UModelIndex *)local_790);
                  parseCpdRegion(this,(UByteArray *)((long)&signature.d.field_2 + 8),0,
                                 (UModelIndex *)local_720,(UModelIndex *)local_790);
                }
                pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::
                          operator[]((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                      *)&firstPtEntry,(size_type)name_1.super_tagbstring.data);
                if (0x2d < (*(uint *)&pvVar15->ptEntry & 0xffff)) {
                  usprintf((CBString *)((long)&padding_2.d.field_2 + 8),
                           "%s: BPDT entry of unknown type found","parseBpdtRegion");
                  msg(this,(CBString *)((long)&padding_2.d.field_2 + 8),(UModelIndex *)local_720);
                  Bstrlib::CBString::~CBString((CBString *)((long)&padding_2.d.field_2 + 8));
                }
                Bstrlib::CBString::~CBString((CBString *)&partitionIndex.m);
                Bstrlib::CBString::~CBString((CBString *)local_5d0);
                UByteArray::~UByteArray((UByteArray *)&info_1.super_tagbstring.data);
                UByteArray::~UByteArray((UByteArray *)((long)&signature.d.field_2 + 8));
                Bstrlib::CBString::~CBString((CBString *)((long)&partition_1.d.field_2 + 8));
              }
              else {
                pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::
                          operator[]((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                      *)&firstPtEntry,(size_type)name_1.super_tagbstring.data);
                pUVar6 = _sbpdtOffsetFixup_local;
                if (pvVar15->type == '@') {
                  pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                            ::operator[]((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                          *)&firstPtEntry,(size_type)name_1.super_tagbstring.data);
                  UVar11 = (pvVar15->ptEntry).Offset;
                  pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                            ::operator[]((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                          *)&firstPtEntry,(size_type)name_1.super_tagbstring.data);
                  UByteArray::mid((UByteArray *)local_7c8,pUVar6,UVar11,(pvVar15->ptEntry).Size);
                  Bstrlib::CBString::CBString(&local_7e0,"Padding");
                  Bstrlib::CBString::operator=((CBString *)&info.super_tagbstring.data,&local_7e0);
                  Bstrlib::CBString::~CBString(&local_7e0);
                  uVar13 = UByteArray::size((UByteArray *)local_7c8);
                  uVar9 = UByteArray::size((UByteArray *)local_7c8);
                  usprintf(&local_7f8,"Full size: %Xh (%u)",(ulong)uVar13,(ulong)uVar9);
                  Bstrlib::CBString::operator=((CBString *)local_128,&local_7f8);
                  Bstrlib::CBString::~CBString(&local_7f8);
                  UVar2 = parent_local._4_4_;
                  pTVar3 = this->model;
                  pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                            ::operator[]((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                          *)&firstPtEntry,(size_type)name_1.super_tagbstring.data);
                  UVar11 = (pvVar15->ptEntry).Offset;
                  UVar8 = getPaddingType((UByteArray *)local_7c8);
                  Bstrlib::CBString::CBString(&local_810);
                  UByteArray::UByteArray(&local_830);
                  UByteArray::UByteArray(&local_850);
                  TreeModel::addItem((UModelIndex *)&usedSize,pTVar3,UVar2 + UVar11,'@',UVar8,
                                     (CBString *)&info.super_tagbstring.data,&local_810,
                                     (CBString *)local_128,&local_830,(UByteArray *)local_7c8,
                                     &local_850,Fixed,index_local,'\0');
                  UByteArray::~UByteArray(&local_850);
                  UByteArray::~UByteArray(&local_830);
                  Bstrlib::CBString::~CBString(&local_810);
                  UByteArray::~UByteArray((UByteArray *)local_7c8);
                }
              }
            }
            pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::back
                                ((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                  *)&firstPtEntry);
            uVar13 = (pvVar15->ptEntry).Offset;
            pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::back
                                ((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                  *)&firstPtEntry);
            if ((ulong)uVar13 + (ulong)(pvVar15->ptEntry).Size < (ulong)local_64) {
              pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::
                        back((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_> *)
                             &firstPtEntry);
              uVar13 = (pvVar15->ptEntry).Offset;
              pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::
                        back((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_> *)
                             &firstPtEntry);
              pUVar6 = _sbpdtOffsetFixup_local;
              padding_3.d.field_2._8_8_ = (ulong)uVar13 + (ulong)(pvVar15->ptEntry).Size;
              pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::
                        back((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_> *)
                             &firstPtEntry);
              UVar11 = (pvVar15->ptEntry).Offset;
              pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::
                        back((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_> *)
                             &firstPtEntry);
              UByteArray::mid((UByteArray *)local_890,pUVar6,UVar11 + (pvVar15->ptEntry).Size,
                              local_64 - padding_3.d.field_2._8_4_);
              Bstrlib::CBString::CBString(&local_8a8,"Padding");
              Bstrlib::CBString::operator=((CBString *)&info.super_tagbstring.data,&local_8a8);
              Bstrlib::CBString::~CBString(&local_8a8);
              uVar13 = UByteArray::size((UByteArray *)local_890);
              uVar9 = UByteArray::size((UByteArray *)local_890);
              usprintf(&local_8c0,"Full size: %Xh (%u)",(ulong)uVar13,(ulong)uVar9);
              Bstrlib::CBString::operator=((CBString *)local_128,&local_8c0);
              Bstrlib::CBString::~CBString(&local_8c0);
              UVar5 = parent_local._4_4_;
              pTVar3 = this->model;
              pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::
                        back((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_> *)
                             &firstPtEntry);
              UVar11 = (pvVar15->ptEntry).Offset;
              pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::
                        back((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_> *)
                             &firstPtEntry);
              UVar2 = (pvVar15->ptEntry).Size;
              UVar8 = getPaddingType((UByteArray *)local_890);
              Bstrlib::CBString::CBString(&local_8d8);
              UByteArray::UByteArray(&local_8f8);
              UByteArray::UByteArray(&local_918);
              TreeModel::addItem(&local_930,pTVar3,UVar5 + UVar11 + UVar2,'@',UVar8,
                                 (CBString *)&info.super_tagbstring.data,&local_8d8,
                                 (CBString *)local_128,&local_8f8,(UByteArray *)local_890,&local_918
                                 ,Fixed,index_local,'\0');
              UByteArray::~UByteArray(&local_918);
              UByteArray::~UByteArray(&local_8f8);
              Bstrlib::CBString::~CBString(&local_8d8);
              UByteArray::~UByteArray((UByteArray *)local_890);
            }
            this_local = (FfsParser *)0x0;
            goto LAB_00127d2e;
          }
          pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::
                    operator[]((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                *)&firstPtEntry,uStack_478 - 1);
          UVar11 = (pvVar15->ptEntry).Offset;
          pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::
                    operator[]((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                *)&firstPtEntry,uStack_478 - 1);
          local_47c = UVar11 + (pvVar15->ptEntry).Size;
          pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::
                    operator[]((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                *)&firstPtEntry,uStack_478);
          uVar9 = (pvVar15->ptEntry).Offset;
          pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::
                    operator[]((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                *)&firstPtEntry,uStack_478);
          if ((ulong)local_64 < (ulong)uVar9 + (ulong)(pvVar15->ptEntry).Size) {
            pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::
                      operator[]((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                  *)&firstPtEntry,uStack_478);
            uVar9 = (pvVar15->ptEntry).Offset;
            iVar12 = UByteArray::size(_sbpdtOffsetFixup_local);
            if ((ulong)(long)iVar12 <= (ulong)uVar9) {
              usprintf(&local_498,
                       "%s: BPDT partition is located outside of the opened image, skipped",
                       "parseBpdtRegion");
              pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::
                        operator[]((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                    *)&firstPtEntry,uStack_478);
              msg(this,&local_498,&pvVar15->index);
              Bstrlib::CBString::~CBString(&local_498);
              local_4b0._M_current =
                   (BPDT_PARTITION_INFO_ *)
                   std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::begin
                             ((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_> *
                              )&firstPtEntry);
              local_4a8 = __gnu_cxx::
                          __normal_iterator<BPDT_PARTITION_INFO__*,_std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>_>
                          ::operator+(&local_4b0,uStack_478);
              __gnu_cxx::
              __normal_iterator<BPDT_PARTITION_INFO_const*,std::vector<BPDT_PARTITION_INFO_,std::allocator<BPDT_PARTITION_INFO_>>>
              ::__normal_iterator<BPDT_PARTITION_INFO_*>
                        ((__normal_iterator<BPDT_PARTITION_INFO_const*,std::vector<BPDT_PARTITION_INFO_,std::allocator<BPDT_PARTITION_INFO_>>>
                          *)&local_4a0,&local_4a8);
              local_4b8 = (BPDT_PARTITION_INFO_ *)
                          std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::
                          erase((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                 *)&firstPtEntry,local_4a0);
              goto LAB_00126592;
            }
            usprintf(&local_4d0,"%s: BPDT partition can\'t fit into its region, truncated",
                     "parseBpdtRegion");
            pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::
                      operator[]((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                  *)&firstPtEntry,uStack_478);
            msg(this,&local_4d0,&pvVar15->index);
            Bstrlib::CBString::~CBString(&local_4d0);
            uVar9 = local_64;
            pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::
                      operator[]((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                  *)&firstPtEntry,uStack_478);
            UVar11 = (pvVar15->ptEntry).Offset;
            pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::
                      operator[]((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                  *)&firstPtEntry,uStack_478);
            (pvVar15->ptEntry).Size = uVar9 - UVar11;
          }
          pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::
                    operator[]((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                *)&firstPtEntry,uStack_478);
          if (local_47c <= (pvVar15->ptEntry).Offset) goto LAB_00126ccc;
          pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::
                    operator[]((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                *)&firstPtEntry,uStack_478);
          UVar11 = (pvVar15->ptEntry).Offset;
          pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::
                    operator[]((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                *)&firstPtEntry,uStack_478);
          if (local_47c < UVar11 + (pvVar15->ptEntry).Size) {
            usprintf(&local_520,"%s: BPDT partition intersects with previous one, skipped",
                     "parseBpdtRegion");
            pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::
                      operator[]((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                  *)&firstPtEntry,uStack_478);
            msg(this,&local_520,&pvVar15->index);
            Bstrlib::CBString::~CBString(&local_520);
            local_538._M_current =
                 (BPDT_PARTITION_INFO_ *)
                 std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::begin
                           ((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_> *)
                            &firstPtEntry);
            local_530 = __gnu_cxx::
                        __normal_iterator<BPDT_PARTITION_INFO__*,_std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>_>
                        ::operator+(&local_538,uStack_478);
            __gnu_cxx::
            __normal_iterator<BPDT_PARTITION_INFO_const*,std::vector<BPDT_PARTITION_INFO_,std::allocator<BPDT_PARTITION_INFO_>>>
            ::__normal_iterator<BPDT_PARTITION_INFO_*>
                      ((__normal_iterator<BPDT_PARTITION_INFO_const*,std::vector<BPDT_PARTITION_INFO_,std::allocator<BPDT_PARTITION_INFO_>>>
                        *)&local_528,&local_530);
            iter = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::erase
                             ((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_> *
                              )&firstPtEntry,local_528);
          }
          else {
            usprintf(&local_4e8,
                     "%s: BPDT partition is located inside another BPDT partition, skipped",
                     "parseBpdtRegion");
            pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::
                      operator[]((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                  *)&firstPtEntry,uStack_478);
            msg(this,&local_4e8,&pvVar15->index);
            Bstrlib::CBString::~CBString(&local_4e8);
            local_500._M_current =
                 (BPDT_PARTITION_INFO_ *)
                 std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::begin
                           ((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_> *)
                            &firstPtEntry);
            local_4f8 = __gnu_cxx::
                        __normal_iterator<BPDT_PARTITION_INFO__*,_std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>_>
                        ::operator+(&local_500,uStack_478);
            __gnu_cxx::
            __normal_iterator<BPDT_PARTITION_INFO_const*,std::vector<BPDT_PARTITION_INFO_,std::allocator<BPDT_PARTITION_INFO_>>>
            ::__normal_iterator<BPDT_PARTITION_INFO_*>
                      ((__normal_iterator<BPDT_PARTITION_INFO_const*,std::vector<BPDT_PARTITION_INFO_,std::allocator<BPDT_PARTITION_INFO_>>>
                        *)&local_4f0,&local_4f8);
            local_508 = (BPDT_PARTITION_INFO_ *)
                        std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::
                        erase((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_> *
                              )&firstPtEntry,local_4f0);
          }
        }
        goto LAB_00126592;
      }
      this_local = (FfsParser *)0xfd;
LAB_00127d2e:
      std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::~vector
                ((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_> *)
                 &firstPtEntry);
      Bstrlib::CBString::~CBString((CBString *)local_128);
      Bstrlib::CBString::~CBString((CBString *)&info.super_tagbstring.data);
      UByteArray::~UByteArray((UByteArray *)&name.super_tagbstring.data);
      UByteArray::~UByteArray((UByteArray *)((long)&body.d.field_2 + 8));
    }
  }
  return (USTATUS)this_local;
LAB_00126ccc:
  pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::operator[]
                      ((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_> *)
                       &firstPtEntry,uStack_478);
  if (local_47c < (pvVar15->ptEntry).Offset) {
    auStack_428._4_4_ = local_47c;
    pvVar15 = std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::operator[]
                        ((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_> *)
                         &firstPtEntry,uStack_478);
    padding.ptEntry.Offset._0_1_ = 0x40;
    padding.ptEntry._0_4_ = (pvVar15->ptEntry).Offset - local_47c;
    local_548._M_current =
         (BPDT_PARTITION_INFO_ *)
         std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::begin
                   ((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_> *)
                    &firstPtEntry);
    std::
    advance<__gnu_cxx::__normal_iterator<BPDT_PARTITION_INFO_*,std::vector<BPDT_PARTITION_INFO_,std::allocator<BPDT_PARTITION_INFO_>>>,unsigned_long>
              (&local_548,uStack_478);
    __gnu_cxx::
    __normal_iterator<BPDT_PARTITION_INFO_const*,std::vector<BPDT_PARTITION_INFO_,std::allocator<BPDT_PARTITION_INFO_>>>
    ::__normal_iterator<BPDT_PARTITION_INFO_*>
              ((__normal_iterator<BPDT_PARTITION_INFO_const*,std::vector<BPDT_PARTITION_INFO_,std::allocator<BPDT_PARTITION_INFO_>>>
                *)&local_550,&local_548);
    std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::insert
              ((vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_> *)&firstPtEntry,
               local_550,(value_type *)auStack_428);
  }
  uStack_478 = uStack_478 + 1;
  goto LAB_001267c6;
}

Assistant:

USTATUS FfsParser::parseBpdtRegion(const UByteArray & region, const UINT32 localOffset, const UINT32 sbpdtOffsetFixup, const UModelIndex & parent, UModelIndex & index)
{
    UINT32 regionSize = (UINT32)region.size();
    
    // Check region size
    if (regionSize < sizeof(BPDT_HEADER)) {
        msg(usprintf("%s: BPDT region too small to fit BPDT partition table header", __FUNCTION__), parent);
        return U_INVALID_ME_PARTITION_TABLE;
    }
    
    // Populate partition table header
    const BPDT_HEADER* ptHeader = (const BPDT_HEADER*)(region.constData());
    
    // Check region size again
    UINT32 ptBodySize = ptHeader->NumEntries * sizeof(BPDT_ENTRY);
    UINT32 ptSize = sizeof(BPDT_HEADER) + ptBodySize;
    if (regionSize < ptSize) {
        msg(usprintf("%s: BPDT region too small to fit BPDT partition table", __FUNCTION__), parent);
        return U_INVALID_ME_PARTITION_TABLE;
    }
    
    // Get info
    UByteArray header = region.left(sizeof(BPDT_HEADER));
    UByteArray body = region.mid(sizeof(BPDT_HEADER), ptBodySize);
    
    UString name = UString("BPDT partition table");
    UString info = usprintf("Full size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\n"
                            "Number of entries: %u\nVersion: %02Xh\nRedundancyFlag: %Xh\n"
                            "IFWI version: %Xh\nFITC version: %u.%u.%u.%u",
                            ptSize, ptSize,
                            (UINT32)header.size(), (UINT32)header.size(),
                            ptBodySize, ptBodySize,
                            ptHeader->NumEntries,
                            ptHeader->HeaderVersion,
                            ptHeader->RedundancyFlag,
                            ptHeader->IfwiVersion,
                            ptHeader->FitcMajor, ptHeader->FitcMinor, ptHeader->FitcHotfix, ptHeader->FitcBuild);
    
    // Add tree item
    index = model->addItem(localOffset, Types::BpdtStore, 0, name, UString(), info, header, body, UByteArray(), Fixed, parent);
    
    // Adjust offset
    UINT32 offset = sizeof(BPDT_HEADER);
    
    // Add partition table entries
    std::vector<BPDT_PARTITION_INFO> partitions;
    const BPDT_ENTRY* firstPtEntry = (const BPDT_ENTRY*)((const UINT8*)ptHeader + sizeof(BPDT_HEADER));
    UINT16 numEntries = ptHeader->NumEntries;
    for (UINT16 i = 0; i < numEntries; i++) {
        // Populate entry header
        const BPDT_ENTRY* ptEntry = firstPtEntry + i;
        
        // Get info
        name = bpdtEntryTypeToUString(ptEntry->Type);
        info = usprintf("Full size: %Xh (%u)\nType: %Xh\nPartition offset: %Xh\nPartition length: %Xh",
                        (UINT32)sizeof(BPDT_ENTRY), (UINT32)sizeof(BPDT_ENTRY),
                        ptEntry->Type,
                        ptEntry->Offset,
                        ptEntry->Size) +
        UString("\nSplit sub-partition first part: ") + (ptEntry->SplitSubPartitionFirstPart ? "Yes" : "No") +
        UString("\nSplit sub-partition second part: ") + (ptEntry->SplitSubPartitionSecondPart ? "Yes" : "No") +
        UString("\nCode sub-partition: ") + (ptEntry->CodeSubPartition ? "Yes" : "No") +
        UString("\nUMA cacheable: ") + (ptEntry->UmaCacheable ? "Yes" : "No");
        
        // Add tree item
        UModelIndex entryIndex = model->addItem(localOffset + offset, Types::BpdtEntry, 0, name, UString(), info, UByteArray(), UByteArray((const char*)ptEntry, sizeof(BPDT_ENTRY)), UByteArray(), Fixed, index);
        
        // Adjust offset
        offset += sizeof(BPDT_ENTRY);
        
        if (ptEntry->Offset != 0 && ptEntry->Offset != 0xFFFFFFFF && ptEntry->Size != 0) {
            // Add to partitions vector
            BPDT_PARTITION_INFO partition = {};
            partition.type = Types::BpdtPartition;
            partition.ptEntry = *ptEntry;
            partition.ptEntry.Offset -= sbpdtOffsetFixup;
            partition.index = entryIndex;
            partitions.push_back(partition);
        }
    }
    
    // Check for empty set of partitions
    if (partitions.empty()) {
        // Add a single padding partition in this case
        BPDT_PARTITION_INFO padding = {};
        padding.ptEntry.Offset = offset;
        padding.ptEntry.Size = (UINT32)(region.size() - padding.ptEntry.Offset);
        padding.type = Types::Padding;
        partitions.push_back(padding);
    }
    
make_partition_table_consistent:
    if (partitions.empty()) {
        return U_INVALID_ME_PARTITION_TABLE;
    }
    // Sort partitions by offset
    std::sort(partitions.begin(), partitions.end());
    
    // Check for intersections and paddings between partitions
    BPDT_PARTITION_INFO padding = {};
    
    // Check intersection with the partition table header
    if (partitions.front().ptEntry.Offset < ptSize) {
        msg(usprintf("%s: BPDT partition has intersection with BPDT partition table, skipped", __FUNCTION__),
            partitions.front().index);
        partitions.erase(partitions.begin());
        goto make_partition_table_consistent;
    }
    // Check for padding between partition table and the first partition
    else if (partitions.front().ptEntry.Offset > ptSize) {
        padding.ptEntry.Offset = ptSize;
        padding.ptEntry.Size = partitions.front().ptEntry.Offset - padding.ptEntry.Offset;
        padding.type = Types::Padding;
        partitions.insert(partitions.begin(), padding);
    }
    // Check for intersections/paddings between partitions
    for (size_t i = 1; i < partitions.size(); i++) {
        UINT32 previousPartitionEnd = partitions[i - 1].ptEntry.Offset + partitions[i - 1].ptEntry.Size;
        
        // Check that partition is fully present in the image
        if ((UINT64)partitions[i].ptEntry.Offset + (UINT64)partitions[i].ptEntry.Size > regionSize) {
            if ((UINT64)partitions[i].ptEntry.Offset >= (UINT64)region.size()) {
                msg(usprintf("%s: BPDT partition is located outside of the opened image, skipped", __FUNCTION__), partitions[i].index);
                partitions.erase(partitions.begin() + i);
                goto make_partition_table_consistent;
            }
            else {
                msg(usprintf("%s: BPDT partition can't fit into its region, truncated", __FUNCTION__), partitions[i].index);
                partitions[i].ptEntry.Size = regionSize - (UINT32)partitions[i].ptEntry.Offset;
            }
        }
        
        // Check for intersection with previous partition
        if (partitions[i].ptEntry.Offset < previousPartitionEnd) {
            // Check if current partition is located inside previous one
            if (partitions[i].ptEntry.Offset + partitions[i].ptEntry.Size <= previousPartitionEnd) {
                msg(usprintf("%s: BPDT partition is located inside another BPDT partition, skipped", __FUNCTION__),
                    partitions[i].index);
                partitions.erase(partitions.begin() + i);
                goto make_partition_table_consistent;
            }
            else {
                msg(usprintf("%s: BPDT partition intersects with previous one, skipped", __FUNCTION__),
                    partitions[i].index);
                partitions.erase(partitions.begin() + i);
                goto make_partition_table_consistent;
            }
        }
        
        // Check for padding between current and previous partitions
        else if (partitions[i].ptEntry.Offset > previousPartitionEnd) {
            padding.ptEntry.Offset = previousPartitionEnd;
            padding.ptEntry.Size = partitions[i].ptEntry.Offset - previousPartitionEnd;
            padding.type = Types::Padding;
            std::vector<BPDT_PARTITION_INFO>::iterator iter = partitions.begin();
            std::advance(iter, i);
            partitions.insert(iter, padding);
        }
    }
    
    // Partition map is consistent
    for (size_t i = 0; i < partitions.size(); i++) {
        if (partitions[i].type == Types::BpdtPartition) {
            // Get info
            UString name = bpdtEntryTypeToUString(partitions[i].ptEntry.Type);
            UByteArray partition = region.mid(partitions[i].ptEntry.Offset, partitions[i].ptEntry.Size);
            UByteArray signature = partition.left(sizeof(UINT32));
            
            UString info = usprintf("Full size: %Xh (%u)\nType: %Xh",
                                    (UINT32)partition.size(), (UINT32)partition.size(),
                                    partitions[i].ptEntry.Type) +
            UString("\nSplit sub-partition first part: ") + (partitions[i].ptEntry.SplitSubPartitionFirstPart ? "Yes" : "No") +
            UString("\nSplit sub-partition second part: ") + (partitions[i].ptEntry.SplitSubPartitionSecondPart ? "Yes" : "No") +
            UString("\nCode sub-partition: ") + (partitions[i].ptEntry.CodeSubPartition ? "Yes" : "No") +
            UString("\nUMA cacheable: ") + (partitions[i].ptEntry.UmaCacheable ? "Yes" : "No");
            
            UString text = bpdtEntryTypeToUString(partitions[i].ptEntry.Type);
            
            // Add tree item
            UModelIndex partitionIndex = model->addItem(localOffset + partitions[i].ptEntry.Offset, Types::BpdtPartition, 0, name, text, info, UByteArray(), partition, UByteArray(), Fixed, parent);
            
            // Special case of S-BPDT
            if (partitions[i].ptEntry.Type == BPDT_ENTRY_TYPE_S_BPDT) {
                UModelIndex sbpdtIndex;
                parseBpdtRegion(partition, 0, partitions[i].ptEntry.Offset, partitionIndex, sbpdtIndex); // Third parameter is a fixup for S-BPDT offset entries, because they are calculated from the start of BIOS region
            }
            
            // Parse code partitions
            if (readUnaligned((const UINT32*)partition.constData()) == CPD_SIGNATURE) {
                // Parse code partition contents
                UModelIndex cpdIndex;
                parseCpdRegion(partition, 0, partitionIndex, cpdIndex);
            }
            
            // Check for entry type to be known
            if (partitions[i].ptEntry.Type > BPDT_ENTRY_TYPE_PSEP) {
                msg(usprintf("%s: BPDT entry of unknown type found", __FUNCTION__), partitionIndex);
            }
        }
        else if (partitions[i].type == Types::Padding) {
            UByteArray padding = region.mid(partitions[i].ptEntry.Offset, partitions[i].ptEntry.Size);
            
            // Get info
            name = UString("Padding");
            info = usprintf("Full size: %Xh (%u)",
                            (UINT32)padding.size(), (UINT32)padding.size());
            
            // Add tree item
            model->addItem(localOffset + partitions[i].ptEntry.Offset, Types::Padding, getPaddingType(padding), name, UString(), info, UByteArray(), padding, UByteArray(), Fixed, parent);
        }
    }
    
    // Add padding after the last region
    if ((UINT64)partitions.back().ptEntry.Offset + (UINT64)partitions.back().ptEntry.Size < regionSize) {
        UINT64 usedSize = (UINT64)partitions.back().ptEntry.Offset + (UINT64)partitions.back().ptEntry.Size;
        UByteArray padding = region.mid(partitions.back().ptEntry.Offset + partitions.back().ptEntry.Size, (int)(regionSize - usedSize));
        
        // Get info
        name = UString("Padding");
        info = usprintf("Full size: %Xh (%u)",
                        (UINT32)padding.size(), (UINT32)padding.size());
        
        // Add tree item
        model->addItem(localOffset + partitions.back().ptEntry.Offset + partitions.back().ptEntry.Size, Types::Padding, getPaddingType(padding), name, UString(), info, UByteArray(), padding, UByteArray(), Fixed, parent);
    }
    
    return U_SUCCESS;
}